

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  bool bVar1;
  Extension *in_RAX;
  RepeatedField<double> *this_00;
  code *cleanup;
  Arena *this_01;
  Extension *extension;
  
  extension = in_RAX;
  bVar1 = MaybeNewExtension(this,number,desc,&extension);
  if (!bVar1) goto switchD_0033afb0_default;
  extension->is_repeated = true;
  extension->type = field_type;
  extension->is_packed = packed;
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
  case 1:
  case 8:
    this_01 = this->arena_;
    if (this_01 != (Arena *)0x0) {
      this_00 = (RepeatedField<double> *)
                Arena::AllocateAligned(this_01,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_00,this_01);
      cleanup = arena_destruct_object<google::protobuf::RepeatedField<int>>;
      break;
    }
LAB_0033b173:
    this_00 = (RepeatedField<double> *)operator_new(0x10);
    this_00->current_size_ = 0;
    this_00->total_size_ = 0;
    this_00->rep_ = (Rep *)0x0;
    goto LAB_0033b184;
  case 2:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b173;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned(this_01,(type_info *)&RepeatedField<long>::typeinfo,0x10);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)this_00,this_01);
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<long>>;
    break;
  case 3:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b173;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned
                        (this_01,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
    RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)this_00,this_01);
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>;
    break;
  case 4:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b173;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned
                        (this_01,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
    RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)this_00,this_01);
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>;
    break;
  case 5:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b173;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned(this_01,(type_info *)&RepeatedField<double>::typeinfo,0x10);
    RepeatedField<double>::RepeatedField(this_00,this_01);
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<double>>;
    break;
  case 6:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b173;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned(this_01,(type_info *)&RepeatedField<float>::typeinfo,0x10);
    RepeatedField<float>::RepeatedField((RepeatedField<float> *)this_00,this_01);
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<float>>;
    break;
  case 7:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b173;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned(this_01,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
    RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)this_00,this_01);
    cleanup = arena_destruct_object<google::protobuf::RepeatedField<bool>>;
    break;
  case 9:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) {
LAB_0033b1cc:
      this_00 = (RepeatedField<double> *)operator_new(0x18);
      this_00->current_size_ = 0;
      this_00->total_size_ = 0;
      this_00->rep_ = (Rep *)0x0;
      this_00[1].current_size_ = 0;
      this_00[1].total_size_ = 0;
      goto LAB_0033b184;
    }
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned
                        (this_01,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18
                        );
    *(Arena **)this_00 = this_01;
    this_00->rep_ = (Rep *)0x0;
    this_00[1].current_size_ = 0;
    this_00[1].total_size_ = 0;
    cleanup = arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>;
    break;
  case 10:
    this_01 = this->arena_;
    if (this_01 == (Arena *)0x0) goto LAB_0033b1cc;
    this_00 = (RepeatedField<double> *)
              Arena::AllocateAligned
                        (this_01,(type_info *)
                                 &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
    *(Arena **)this_00 = this_01;
    this_00->rep_ = (Rep *)0x0;
    this_00[1].current_size_ = 0;
    this_00[1].total_size_ = 0;
    cleanup = 
    arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>;
    break;
  default:
    goto switchD_0033afb0_default;
  }
  Arena::AddListNode(this_01,this_00,cleanup);
LAB_0033b184:
  (extension->field_0).repeated_string_value =
       (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this_00;
switchD_0033afb0_default:
  return (void *)(extension->field_0).int64_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_value =
            Arena::CreateMessage<RepeatedField<int32> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_value =
            Arena::CreateMessage<RepeatedField<int64> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_value =
            Arena::CreateMessage<RepeatedField<uint32> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_value =
            Arena::CreateMessage<RepeatedField<uint64> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField< ::std::string> >(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}